

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexTriangleFilter::splitAndApply
          (PtexTriangleFilter *this,PtexTriangleKernel *k,int faceid,FaceInfo *f)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  PtexTriangleKernel ka;
  PtexTriangleKernel local_58;
  
  if ((k->u1 <= 0.0 && k->u1 != 0.0) && (-1 < f->adjfaces[2])) {
    local_58.res = k->res;
    local_58._2_2_ = *(undefined2 *)&k->field_0x2;
    local_58.u = k->u;
    local_58.v = k->v;
    local_58.u1 = k->u1;
    local_58.v1 = k->v1;
    local_58.w1 = k->w1;
    uVar1._0_4_ = k->u2;
    uVar1._4_4_ = k->v2;
    local_58.w2 = k->w2;
    local_58.A = k->A;
    local_58.B = k->B;
    local_58.C = k->C;
    k->u1 = 0.0;
    local_58._24_8_ = uVar1 & 0xffffffff00000000;
    applyAcrossEdge(this,&local_58,f,2);
  }
  if ((k->v1 <= 0.0 && k->v1 != 0.0) && (-1 < f->adjfaces[0])) {
    local_58.res = k->res;
    local_58._2_2_ = *(undefined2 *)&k->field_0x2;
    local_58.u = k->u;
    local_58.v = k->v;
    local_58.u1 = k->u1;
    local_58.v1 = k->v1;
    local_58.w1 = k->w1;
    uVar2._0_4_ = k->u2;
    uVar2._4_4_ = k->v2;
    local_58.w2 = k->w2;
    local_58.A = k->A;
    local_58.B = k->B;
    local_58.C = k->C;
    k->v1 = 0.0;
    local_58._24_8_ = uVar2 & 0xffffffff;
    applyAcrossEdge(this,&local_58,f,0);
  }
  if ((k->w1 <= 0.0 && k->w1 != 0.0) && (-1 < f->adjfaces[1])) {
    local_58.res = k->res;
    local_58._2_2_ = *(undefined2 *)&k->field_0x2;
    local_58.u = k->u;
    local_58.v = k->v;
    local_58.u1 = k->u1;
    local_58.v1 = k->v1;
    local_58.w1 = k->w1;
    local_58.u2 = k->u2;
    local_58.v2 = k->v2;
    uVar3._0_4_ = k->w2;
    uVar3._4_4_ = k->A;
    local_58.B = k->B;
    local_58.C = k->C;
    k->w1 = 0.0;
    local_58._32_8_ = uVar3 & 0xffffffff00000000;
    applyAcrossEdge(this,&local_58,f,1);
  }
  apply(this,k,faceid,f);
  return;
}

Assistant:

void PtexTriangleFilter::splitAndApply(PtexTriangleKernel& k, int faceid, const Ptex::FaceInfo& f)
{
    // do we need to split? if so, split kernel and apply across edge(s)
    if (k.u1 < 0 && f.adjface(2) >= 0) {
        PtexTriangleKernel ka;
        k.splitU(ka);
        applyAcrossEdge(ka, f, 2);
    }
    if (k.v1 < 0 && f.adjface(0) >= 0) {
        PtexTriangleKernel ka;
        k.splitV(ka);
        applyAcrossEdge(ka, f, 0);
    }
    if (k.w1 < 0 && f.adjface(1) >= 0) {
        PtexTriangleKernel ka;
        k.splitW(ka);
        applyAcrossEdge(ka, f, 1);
    }
    // apply to local face
    apply(k, faceid, f);
}